

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_pubkey_load(secp256k1_context *ctx,secp256k1_ge *ge,secp256k1_pubkey *pubkey)

{
  int iVar1;
  undefined1 local_68 [8];
  secp256k1_ge_storage s;
  secp256k1_pubkey *pubkey_local;
  secp256k1_ge *ge_local;
  secp256k1_context *ctx_local;
  
  s.y.n[3] = (uint64_t)pubkey;
  memcpy(local_68,pubkey,0x40);
  secp256k1_ge_from_storage(ge,(secp256k1_ge_storage *)local_68);
  iVar1 = secp256k1_fe_is_zero(&ge->x);
  if (iVar1 != 0) {
    secp256k1_callback_call(&ctx->illegal_callback,"!secp256k1_fe_is_zero(&ge->x)");
  }
  ctx_local._4_4_ = (uint)(iVar1 == 0);
  return ctx_local._4_4_;
}

Assistant:

static int secp256k1_pubkey_load(const secp256k1_context* ctx, secp256k1_ge* ge, const secp256k1_pubkey* pubkey) {
    if (sizeof(secp256k1_ge_storage) == 64) {
        /* When the secp256k1_ge_storage type is exactly 64 byte, use its
         * representation inside secp256k1_pubkey, as conversion is very fast.
         * Note that secp256k1_pubkey_save must use the same representation. */
        secp256k1_ge_storage s;
        memcpy(&s, &pubkey->data[0], sizeof(s));
        secp256k1_ge_from_storage(ge, &s);
    } else {
        /* Otherwise, fall back to 32-byte big endian for X and Y. */
        secp256k1_fe x, y;
        secp256k1_fe_set_b32(&x, pubkey->data);
        secp256k1_fe_set_b32(&y, pubkey->data + 32);
        secp256k1_ge_set_xy(ge, &x, &y);
    }
    ARG_CHECK(!secp256k1_fe_is_zero(&ge->x));
    return 1;
}